

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O3

int h262_slice(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,h262_slice *slice)

{
  undefined8 *puVar1;
  h262_macroblock *phVar2;
  undefined8 picparm_00;
  int iVar3;
  h262_seqparm *seqparm_00;
  uint uVar4;
  long lVar6;
  uint32_t uVar7;
  uint32_t tmp;
  uint32_t qsc;
  undefined1 local_60 [24];
  ulong local_48;
  h262_seqparm *local_40;
  ulong local_38;
  ulong uVar5;
  
  iVar3 = vs_u(str,&slice->quantiser_scale_code,5);
  if (iVar3 == 0) {
    iVar3 = vs_u(str,&slice->intra_slice_flag,1);
    if (iVar3 == 0) {
      if (slice->intra_slice_flag == 0) {
LAB_00105268:
        local_60._0_4_ = slice->first_mb_in_slice % picparm->pic_width_in_mbs;
        iVar3 = h262_mb_addr_inc(str,(uint32_t *)local_60);
        if (iVar3 == 0) {
          if ((uint)local_60._0_4_ < picparm->pic_width_in_mbs) {
            uVar4 = picparm->pic_width_in_mbs * slice->slice_vertical_position + local_60._0_4_;
            uVar5 = (ulong)uVar4;
            slice->first_mb_in_slice = uVar4;
            local_60._12_4_ = slice->quantiser_scale_code;
            iVar3 = h262_macroblock(str,seqparm,picparm,slice->mbs + uVar5,
                                    (uint32_t *)(local_60 + 0xc));
            local_40 = seqparm;
            uVar4 = local_60._0_4_;
            while (iVar3 == 0) {
              uVar7 = (uint32_t)uVar5;
              if (str->dir == VS_DECODE) {
                slice->last_mb_in_slice = uVar7;
                local_60._0_4_ = uVar4;
                iVar3 = vs_has_more_data(str);
                if (iVar3 == 0) {
                  return 0;
                }
                seqparm_00 = (h262_seqparm *)local_60;
                iVar3 = h262_mb_addr_inc(str,(uint32_t *)seqparm_00);
                if (iVar3 != 0) {
                  return 1;
                }
                uVar4 = uVar7 + 1;
                uVar5 = (ulong)uVar4;
                if (picparm->pic_size_in_mbs <= uVar4) {
                  h262_slice_cold_3();
                  return 1;
                }
                if (local_60._0_4_ != 0) {
                  local_38 = (ulong)uVar4;
                  lVar6 = local_38 * 0xc84;
                  local_60._8_4_ = -local_60._0_4_;
                  uVar7 = 0;
                  local_60._16_8_ = picparm;
                  local_48 = uVar5;
                  do {
                    picparm_00 = local_60._16_8_;
                    local_38 = local_38 + 1;
                    phVar2 = slice->mbs;
                    *(undefined4 *)
                     ((long)&((h262_macroblock *)(phVar2->motion_vertical_field_select + -5))->
                             macroblock_skipped + lVar6) = 1;
                    puVar1 = (undefined8 *)
                             ((long)((h262_macroblock *)
                                    (((h262_macroblock *)
                                     (((h262_macroblock *)
                                      (phVar2->motion_vertical_field_select + -5))->
                                      motion_vertical_field_select + -5))->
                                     motion_vertical_field_select + -5))->
                                    motion_vertical_field_select + lVar6 + 0xffffffffffffffdcU);
                    *puVar1 = 0;
                    puVar1[1] = 0;
                    *(undefined4 *)((long)(phVar2->motion_vertical_field_select + -3) + lVar6 + 4) =
                         0;
                    iVar3 = h262_infer_vectors(str,seqparm_00,(h262_picparm *)local_60._16_8_,
                                               (h262_macroblock *)
                                               ((long)&((h262_macroblock *)
                                                       (phVar2->motion_vertical_field_select + -5))
                                                       ->macroblock_skipped + lVar6),0);
                    if (iVar3 != 0) {
                      return 1;
                    }
                    iVar3 = h262_infer_vectors(str,seqparm_00,(h262_picparm *)picparm_00,
                                               (h262_macroblock *)
                                               ((long)&((h262_macroblock *)
                                                       (slice->mbs->motion_vertical_field_select +
                                                       -5))->macroblock_skipped + lVar6),1);
                    if (iVar3 != 0) {
                      return 1;
                    }
                    if (*(uint32_t *)(picparm_00 + 0x4a8) <= local_38) {
                      h262_slice_cold_4();
                      return 1;
                    }
                    lVar6 = lVar6 + 0xc84;
                    uVar7 = uVar7 - 1;
                  } while (local_60._8_4_ != uVar7);
                  uVar5 = (ulong)((int)local_48 - uVar7);
                  picparm = (h262_picparm *)local_60._16_8_;
                }
                local_60._0_4_ = 0;
              }
              else {
                if (slice->last_mb_in_slice == uVar7) {
                  return 0;
                }
                local_60._0_4_ = 0;
                while (uVar5 = (ulong)(local_60._0_4_ + uVar7),
                      slice->mbs[uVar5].macroblock_skipped != 0) {
                  local_60._0_4_ = local_60._0_4_ + 1;
                  if ((uVar7 - slice->last_mb_in_slice) + local_60._0_4_ == 0) {
                    local_60._0_4_ = uVar4;
                    h262_slice_cold_2();
                    return 1;
                  }
                }
                iVar3 = h262_mb_addr_inc(str,(uint32_t *)local_60);
                if (iVar3 != 0) {
                  return 1;
                }
              }
              iVar3 = h262_macroblock(str,local_40,picparm,slice->mbs + uVar5,
                                      (uint32_t *)(local_60 + 0xc));
              uVar4 = local_60._0_4_;
            }
          }
          else {
            h262_slice_cold_1();
          }
        }
      }
      else {
        iVar3 = vs_u(str,&slice->intra_slice,1);
        if (iVar3 == 0) {
          local_60._4_4_ = 0;
          iVar3 = vs_u(str,(uint32_t *)(local_60 + 4),8);
          if (iVar3 == 0) {
            do {
              if ((local_60._4_4_ & 1) == 0) goto LAB_00105268;
              iVar3 = vs_u(str,(uint32_t *)(local_60 + 4),9);
            } while (iVar3 == 0);
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int h262_slice(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_slice *slice) {
	if (vs_u(str, &slice->quantiser_scale_code, 5))
		return 1;
	if (vs_u(str, &slice->intra_slice_flag, 1)) return 1;
	if (slice->intra_slice_flag) {
		if (vs_u(str, &slice->intra_slice, 1)) return 1;
		uint32_t tmp = 0;
		if (vs_u(str, &tmp, 8)) return 1;
		while(tmp & 1) {
			if (vs_u(str, &tmp, 9)) return 1;
		}
	}
	uint32_t tmp = slice->first_mb_in_slice % picparm->pic_width_in_mbs;
	if (h262_mb_addr_inc(str, &tmp)) return 1;
	if (tmp >= picparm->pic_width_in_mbs) {
		fprintf(stderr, "Initial mb_addr_inc too large\n");
		return 1;
	}
	slice->first_mb_in_slice = slice->slice_vertical_position * picparm->pic_width_in_mbs + tmp;
	uint32_t qsc = slice->quantiser_scale_code;
	uint32_t curr_mb_addr = slice->first_mb_in_slice;
	while (1) {
		if (h262_macroblock(str, seqparm, picparm, &slice->mbs[curr_mb_addr], &qsc)) return 1;
		if (str->dir == VS_DECODE) {
			slice->last_mb_in_slice = curr_mb_addr;
			curr_mb_addr++;
			if (!vs_has_more_data(str))
				return 0;
			if (h262_mb_addr_inc(str, &tmp)) return 1;
			if (curr_mb_addr >= picparm->pic_size_in_mbs) {
				fprintf(stderr, "MB index overflow\n");
				return 1;
			}
			while (tmp) {
				slice->mbs[curr_mb_addr].macroblock_skipped = 1;
				slice->mbs[curr_mb_addr].macroblock_quant = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_forward = 0;
				slice->mbs[curr_mb_addr].macroblock_motion_backward = 0;
				slice->mbs[curr_mb_addr].macroblock_pattern = 0;
				slice->mbs[curr_mb_addr].macroblock_intra = 0;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 0)) return 1;
				if (h262_infer_vectors(str, seqparm, picparm, &slice->mbs[curr_mb_addr], 1)) return 1;
				curr_mb_addr++;
				if (curr_mb_addr >= picparm->pic_size_in_mbs) {
					fprintf(stderr, "MB index overflow\n");
					return 1;
				}
				tmp--;
			}
		} else {
			if (slice->last_mb_in_slice == curr_mb_addr) {
				return 0;
			}
			tmp = 0;
			while (slice->last_mb_in_slice != curr_mb_addr && slice->mbs[curr_mb_addr].macroblock_skipped) {
				tmp++;
				curr_mb_addr++;
			}
			if (slice->last_mb_in_slice == curr_mb_addr) {
				fprintf(stderr, "Last MB in slice is skipped\n");
				return 1;
			}
			if (h262_mb_addr_inc(str, &tmp)) return 1;
		}
	}
	return 0;
}